

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::parseConstTree
          (TIntermediate *this,TIntermNode *root,TConstUnionArray *unionArray,
          TOperator constructorType,TType *t,bool singleConstantParam)

{
  undefined1 local_b8 [8];
  TConstTraverser it;
  bool singleConstantParam_local;
  TType *t_local;
  TOperator constructorType_local;
  TConstUnionArray *unionArray_local;
  TIntermNode *root_local;
  TIntermediate *this_local;
  
  if (root == (TIntermNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    it.matrixRows._3_1_ = singleConstantParam;
    TConstTraverser::TConstTraverser
              ((TConstTraverser *)local_b8,unionArray,singleConstantParam,constructorType,t);
    (*root->_vptr_TIntermNode[2])(root,local_b8);
    this_local._7_1_ = (it.type._5_1_ & 1) != 0;
    TConstTraverser::~TConstTraverser((TConstTraverser *)local_b8);
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::parseConstTree(TIntermNode* root, TConstUnionArray unionArray, TOperator constructorType, const TType& t, bool singleConstantParam)
{
    if (root == nullptr)
        return false;

    TConstTraverser it(unionArray, singleConstantParam, constructorType, t);

    root->traverse(&it);
    if (it.error)
        return true;
    else
        return false;
}